

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  Curl_share *pCVar3;
  curl_slist *pcVar4;
  curl_trc_feat *pcVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  size_t sVar9;
  void *pvVar10;
  Curl_dns_entry *p;
  char *pcVar11;
  Curl_addrinfo *pCVar12;
  size_t in_R8;
  Curl_hash *pCVar13;
  Curl_addrinfo *addr;
  bool bVar14;
  char *host;
  Curl_str source;
  curl_off_t port;
  char address [64];
  curl_off_t num;
  char entry_id [262];
  char *local_2d8;
  Curl_str local_2d0;
  size_t local_2c0;
  Curl_addrinfo *local_2b8;
  Curl_easy *local_2b0;
  Curl_hash *local_2a8;
  CURLcode local_29c;
  char *local_298;
  Curl_addrinfo *local_290;
  char local_288 [64];
  Curl_str local_248 [17];
  char local_138 [264];
  
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 8) == 0)) {
    local_2a8 = &(data->multi->dnscache).entries;
    if (data->multi == (Curl_multi *)0x0) {
      local_2a8 = (Curl_hash *)0x0;
    }
  }
  else {
    local_2a8 = &(pCVar3->dnscache).entries;
  }
  if (local_2a8 == (Curl_hash *)0x0) {
    CVar8 = CURLE_FAILED_INIT;
  }
  else {
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 & 0xfb;
    local_2b0 = data;
    for (pcVar4 = (data->state).resolve; pcVar4 != (curl_slist *)0x0; pcVar4 = pcVar4->next) {
      local_2d8 = pcVar4->data;
      if (local_2d8 == (char *)0x0) {
        uVar7 = 0;
      }
      else {
        if (*local_2d8 == '-') {
          local_248[0].str = (char *)0x0;
          local_2d8 = local_2d8 + 1;
          iVar6 = Curl_str_single(&local_2d8,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&local_2d8,&local_2d0,0x2e,']');
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_2d8,']');
              goto LAB_00133d5c;
            }
LAB_00133f2f:
            bVar14 = false;
          }
          else {
            iVar6 = Curl_str_until(&local_2d8,&local_2d0,0x1000,':');
LAB_00133d5c:
            if ((iVar6 != 0) || (iVar6 = Curl_str_single(&local_2d8,':'), iVar6 != 0))
            goto LAB_00133f2f;
            iVar6 = Curl_str_number(&local_2d8,(curl_off_t *)local_248,0xffff);
            bVar14 = true;
            if (iVar6 == 0) {
              sVar9 = create_dnscache_id(local_2d0.str,
                                         CONCAT44(local_2d0.len._4_4_,(uint)local_2d0.len),
                                         (int)local_248[0].str,local_138,in_R8);
              if ((data->share != (Curl_share *)0x0) &&
                 (&(data->share->dnscache).entries == local_2a8)) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pCVar13 = local_2a8;
              Curl_hash_delete(local_2a8,local_138,sVar9 + 1);
              if ((data->share != (Curl_share *)0x0) &&
                 (&(data->share->dnscache).entries == pCVar13)) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
            }
          }
          uVar7 = 0;
          if (!bVar14) goto LAB_00133f37;
        }
        else {
          local_2c0 = 0;
          cVar2 = *local_2d8;
          if (cVar2 == '+') {
            local_2d8 = local_2d8 + 1;
          }
          iVar6 = Curl_str_single(&local_2d8,'[');
          if (iVar6 == 0) {
            iVar6 = Curl_str_until(&local_2d8,&local_2d0,0x2e,']');
            uVar7 = 4;
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_2d8,']');
              goto LAB_00133e83;
            }
          }
          else {
            iVar6 = Curl_str_until(&local_2d8,&local_2d0,0x1000,':');
LAB_00133e83:
            uVar7 = 4;
            if (iVar6 == 0) {
              iVar6 = Curl_str_single(&local_2d8,':');
              bVar14 = true;
              if (((iVar6 == 0) &&
                  (iVar6 = Curl_str_number(&local_2d8,(curl_off_t *)&local_2c0,0xffff), iVar6 == 0))
                 && (iVar6 = Curl_str_single(&local_2d8,':'), iVar6 == 0)) {
                local_298 = local_2d8;
                if (*local_2d8 != '\0') {
                  local_290 = (Curl_addrinfo *)0x0;
                  addr = (Curl_addrinfo *)0x0;
LAB_00134244:
                  local_2b8 = addr;
                  iVar6 = Curl_str_single(&local_2d8,'[');
                  if (iVar6 == 0) {
                    iVar6 = Curl_str_until(&local_2d8,local_248,0x2e,']');
                    addr = local_2b8;
                    uVar7 = 5;
                    if ((iVar6 == 0) &&
                       (iVar6 = Curl_str_single(&local_2d8,']'), addr = local_2b8, iVar6 == 0))
                    goto LAB_001342cb;
                  }
                  else {
                    iVar6 = Curl_str_until(&local_2d8,local_248,0x1000,',');
                    if (iVar6 == 0) {
LAB_001342cb:
                      sVar9 = local_248[0].len;
                      uVar7 = 5;
                      addr = local_2b8;
                      data = local_2b0;
                      if (local_248[0].len < 0x40) {
                        memcpy(local_288,local_248[0].str,local_248[0].len);
                        local_288[sVar9] = '\0';
                        pCVar12 = Curl_str2addr(local_288,(int)local_2c0);
                        data = local_2b0;
                        addr = local_2b8;
                        if (pCVar12 == (Curl_addrinfo *)0x0) {
                          if (((local_2b0 != (Curl_easy *)0x0) &&
                              (((local_2b0->set).field_0x89f & 0x40) != 0)) &&
                             ((pcVar5 = (local_2b0->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                              (0 < pcVar5->log_level)))) {
                            Curl_infof(local_2b0,"Resolve address \'%s\' found illegal",local_288);
                          }
                        }
                        else {
                          addr = pCVar12;
                          if (local_290 != (Curl_addrinfo *)0x0) {
                            local_290->ai_next = pCVar12;
                            addr = local_2b8;
                          }
                          uVar7 = Curl_str_single(&local_2d8,',');
                          data = local_2b0;
                          local_290 = pCVar12;
                          if (uVar7 != 0) {
                            uVar7 = 7;
                          }
                        }
                      }
                    }
                    else {
                      iVar6 = Curl_str_single(&local_2d8,',');
                      addr = local_2b8;
                      uVar7 = (iVar6 == 0) + 5;
                    }
                  }
                  switch(uVar7) {
                  case 0:
                  case 6:
                    goto switchD_00134301_caseD_0;
                  default:
                    goto switchD_00134301_caseD_1;
                  case 5:
                    goto switchD_00134301_caseD_5;
                  case 7:
                    goto switchD_00134301_caseD_7;
                  }
                }
                addr = (Curl_addrinfo *)0x0;
switchD_00134301_caseD_7:
                bVar14 = addr == (Curl_addrinfo *)0x0;
switchD_00134301_caseD_5:
                pcVar11 = local_298;
              }
              else {
                addr = (Curl_addrinfo *)0x0;
                pcVar11 = (char *)0x0;
              }
              if (bVar14) {
                Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar4->data);
                Curl_freeaddrinfo(addr);
                local_29c = CURLE_SETOPT_OPTION_SYNTAX;
                uVar7 = 1;
switchD_00134301_caseD_1:
              }
              else {
                local_298 = pcVar11;
                sVar9 = create_dnscache_id(local_2d0.str,
                                           CONCAT44(local_2d0.len._4_4_,(uint)local_2d0.len),
                                           (int)local_2c0,local_138,in_R8);
                pCVar13 = local_2a8;
                if ((data->share != (Curl_share *)0x0) &&
                   (&(data->share->dnscache).entries == local_2a8)) {
                  Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
                }
                pvVar10 = Curl_hash_pick(pCVar13,local_138,sVar9 + 1);
                if (pvVar10 != (void *)0x0) {
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar5->log_level)))) {
                    Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",
                               (ulong)(uint)local_2d0.len,local_2d0.str,local_2c0);
                  }
                  Curl_hash_delete(pCVar13,local_138,sVar9 + 1);
                }
                pcVar11 = local_2d0.str;
                sVar9 = CONCAT44(local_2d0.len._4_4_,(uint)local_2d0.len);
                iVar6 = (int)local_2c0;
                in_R8 = local_2c0 & 0xffffffff;
                p = Curl_dnscache_mk_entry
                              (data,addr,local_2d0.str,sVar9,(int)local_2c0,cVar2 != '+');
                if (p == (Curl_dns_entry *)0x0) {
                  pvVar10 = (void *)0x0;
                  pCVar13 = local_2a8;
                }
                else {
                  sVar9 = create_dnscache_id(pcVar11,sVar9,iVar6,(char *)local_248,in_R8);
                  pCVar13 = local_2a8;
                  pvVar10 = Curl_hash_add(local_2a8,local_248,sVar9 + 1,p);
                  if (pvVar10 == (void *)0x0) {
                    Curl_freeaddrinfo(p->addr);
                    (*Curl_cfree)(p);
                    pvVar10 = (void *)0x0;
                  }
                  else {
                    *(long *)((long)pvVar10 + 0x10) = *(long *)((long)pvVar10 + 0x10) + 1;
                  }
                }
                data = local_2b0;
                if (pvVar10 == (void *)0x0) {
                  local_29c = CURLE_OUT_OF_MEMORY;
                  uVar7 = 1;
                  if ((local_2b0->share != (Curl_share *)0x0) &&
                     (&(local_2b0->share->dnscache).entries == pCVar13)) {
                    Curl_share_unlock(local_2b0,CURL_LOCK_DATA_DNS);
                  }
                }
                else {
                  *(long *)((long)pvVar10 + 0x10) = *(long *)((long)pvVar10 + 0x10) + -1;
                  if ((local_2b0->share != (Curl_share *)0x0) &&
                     (&(local_2b0->share->dnscache).entries == pCVar13)) {
                    Curl_share_unlock(local_2b0,CURL_LOCK_DATA_DNS);
                  }
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                     ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar5->log_level)))) {
                    pcVar11 = " (non-permanent)";
                    if (cVar2 != '+') {
                      pcVar11 = "";
                    }
                    in_R8 = local_2c0;
                    Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)local_2d0.len,
                               local_2d0.str,local_2c0,local_298,pcVar11);
                  }
                  iVar6 = Curl_str_casecompare(&local_2d0,"*");
                  uVar7 = 0;
                  if (iVar6 != 0) {
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar5->log_level)))) {
                      Curl_infof(data,"RESOLVE *:%ld using wildcard",local_2c0);
                    }
                    puVar1 = &(data->state).field_0x7c0;
                    *puVar1 = *puVar1 | 4;
                  }
                }
              }
            }
          }
          if (uVar7 != 0) goto LAB_00133f37;
        }
        uVar7 = 0;
      }
LAB_00133f37:
      if ((uVar7 & 0xfffffffb) != 0) {
        return local_29c;
      }
    }
    (data->state).resolve = (curl_slist *)0x0;
    CVar8 = CURLE_OK;
  }
  return CVar8;
switchD_00134301_caseD_0:
  if (*local_2d8 == '\0') goto switchD_00134301_caseD_7;
  goto LAB_00134244;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}